

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundingbox.h
# Opt level: O2

bool __thiscall BoundingBox::intersect(BoundingBox *this,Ray *r,float tmin,float tmax)

{
  Vector3f *pVVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float *pfVar5;
  bool bVar6;
  BoundingBox *pBVar7;
  float fVar8;
  Vector3f s;
  Vector3f o;
  Vector3f d;
  Vector3f local_34;
  
  Vector3f::Vector3f(&o,&r->o);
  Vector3f::Vector3f(&d,&r->d);
  pfVar5 = Vector3f::operator[](&this->a,0);
  fVar2 = *pfVar5;
  pfVar5 = Vector3f::operator[](&o,0);
  if (fVar2 + -0.01 <= *pfVar5) {
    pfVar5 = Vector3f::operator[](&o,0);
    fVar2 = *pfVar5;
    pVVar1 = &this->b;
    pfVar5 = Vector3f::operator[](pVVar1,0);
    if (fVar2 <= *pfVar5 + 0.01) {
      pfVar5 = Vector3f::operator[](&this->a,1);
      fVar2 = *pfVar5;
      pfVar5 = Vector3f::operator[](&o,1);
      if (fVar2 + -0.01 <= *pfVar5) {
        pfVar5 = Vector3f::operator[](&o,1);
        fVar2 = *pfVar5;
        pfVar5 = Vector3f::operator[](pVVar1,1);
        if (fVar2 <= *pfVar5 + 0.01) {
          pfVar5 = Vector3f::operator[](&this->a,2);
          fVar2 = *pfVar5;
          pfVar5 = Vector3f::operator[](&o,2);
          if (fVar2 + -0.01 <= *pfVar5) {
            pfVar5 = Vector3f::operator[](&o,2);
            fVar2 = *pfVar5;
            pfVar5 = Vector3f::operator[](pVVar1,2);
            if (fVar2 <= *pfVar5 + 0.01) {
              return true;
            }
          }
        }
      }
    }
  }
  pfVar5 = Vector3f::operator[](&this->a,0);
  fVar2 = *pfVar5;
  pVVar1 = &this->b;
  pfVar5 = Vector3f::operator[](pVVar1,0);
  if (*pfVar5 < fVar2) {
    return false;
  }
  fVar2 = tmin + -0.01;
  fVar4 = tmax + 0.01;
  pfVar5 = Vector3f::operator[](&d,0);
  if ((*pfVar5 != 0.0) || (NAN(*pfVar5))) {
    pfVar5 = Vector3f::operator[](&d,0);
    pBVar7 = (BoundingBox *)pVVar1;
    if (0.0 < *pfVar5) {
      pBVar7 = this;
    }
    pfVar5 = Vector3f::operator[](&pBVar7->a,0);
    fVar8 = *pfVar5;
    pfVar5 = Vector3f::operator[](&o,0);
    fVar3 = *pfVar5;
    pfVar5 = Vector3f::operator[](&d,0);
    fVar8 = (fVar8 - fVar3) / *pfVar5;
    if ((fVar8 < fVar2) || (fVar4 < fVar8)) goto LAB_0019e4d1;
    ::operator*(fVar8,&local_34);
    operator+(&o,&local_34);
    pfVar5 = Vector3f::operator[](&this->a,1);
    fVar8 = *pfVar5;
    pfVar5 = Vector3f::operator[](&s,1);
    if (*pfVar5 < fVar8 + -0.01) goto LAB_0019e4d1;
    pfVar5 = Vector3f::operator[](&s,1);
    fVar8 = *pfVar5;
    pfVar5 = Vector3f::operator[](pVVar1,1);
    if (*pfVar5 + 0.01 < fVar8) goto LAB_0019e4d1;
    pfVar5 = Vector3f::operator[](&this->a,2);
    fVar8 = *pfVar5;
    pfVar5 = Vector3f::operator[](&s,2);
    if (*pfVar5 < fVar8 + -0.01) goto LAB_0019e4d1;
    pfVar5 = Vector3f::operator[](&s,2);
    fVar8 = *pfVar5;
    pfVar5 = Vector3f::operator[](pVVar1,2);
    if (*pfVar5 + 0.01 < fVar8) goto LAB_0019e4d1;
LAB_0019e82c:
    bVar6 = true;
  }
  else {
LAB_0019e4d1:
    pfVar5 = Vector3f::operator[](&d,1);
    if ((*pfVar5 != 0.0) || (NAN(*pfVar5))) {
      pfVar5 = Vector3f::operator[](&d,1);
      pBVar7 = (BoundingBox *)pVVar1;
      if (0.0 < *pfVar5) {
        pBVar7 = this;
      }
      pfVar5 = Vector3f::operator[](&pBVar7->a,1);
      fVar8 = *pfVar5;
      pfVar5 = Vector3f::operator[](&o,1);
      fVar3 = *pfVar5;
      pfVar5 = Vector3f::operator[](&d,1);
      fVar8 = (fVar8 - fVar3) / *pfVar5;
      if ((fVar2 <= fVar8) && (fVar8 <= fVar4)) {
        ::operator*(fVar8,&local_34);
        operator+(&o,&local_34);
        pfVar5 = Vector3f::operator[](&this->a,0);
        fVar8 = *pfVar5;
        pfVar5 = Vector3f::operator[](&s,0);
        if (fVar8 + -0.01 <= *pfVar5) {
          pfVar5 = Vector3f::operator[](&s,0);
          fVar8 = *pfVar5;
          pfVar5 = Vector3f::operator[](pVVar1,0);
          if (fVar8 <= *pfVar5 + 0.01) {
            pfVar5 = Vector3f::operator[](&this->a,2);
            fVar8 = *pfVar5;
            pfVar5 = Vector3f::operator[](&s,2);
            if (fVar8 + -0.01 <= *pfVar5) {
              pfVar5 = Vector3f::operator[](&s,2);
              fVar8 = *pfVar5;
              pfVar5 = Vector3f::operator[](pVVar1,2);
              if (fVar8 <= *pfVar5 + 0.01) goto LAB_0019e82c;
            }
          }
        }
      }
    }
    pfVar5 = Vector3f::operator[](&d,2);
    if ((*pfVar5 != 0.0) || (NAN(*pfVar5))) {
      pfVar5 = Vector3f::operator[](&d,2);
      pBVar7 = (BoundingBox *)pVVar1;
      if (0.0 < *pfVar5) {
        pBVar7 = this;
      }
      pfVar5 = Vector3f::operator[](&pBVar7->a,2);
      fVar8 = *pfVar5;
      pfVar5 = Vector3f::operator[](&o,2);
      fVar3 = *pfVar5;
      pfVar5 = Vector3f::operator[](&d,2);
      fVar8 = (fVar8 - fVar3) / *pfVar5;
      if (fVar8 < fVar2) {
        return false;
      }
      if (fVar4 < fVar8) {
        return false;
      }
      ::operator*(fVar8,&local_34);
      operator+(&o,&local_34);
      pfVar5 = Vector3f::operator[](&this->a,1);
      fVar2 = *pfVar5;
      pfVar5 = Vector3f::operator[](&s,1);
      if (fVar2 + -0.01 <= *pfVar5) {
        pfVar5 = Vector3f::operator[](&s,1);
        fVar2 = *pfVar5;
        pfVar5 = Vector3f::operator[](pVVar1,1);
        if (fVar2 <= *pfVar5 + 0.01) {
          pfVar5 = Vector3f::operator[](&this->a,0);
          fVar2 = *pfVar5;
          pfVar5 = Vector3f::operator[](&s,0);
          if (fVar2 + -0.01 <= *pfVar5) {
            pfVar5 = Vector3f::operator[](&s,0);
            fVar2 = *pfVar5;
            pfVar5 = Vector3f::operator[](pVVar1,0);
            if (fVar2 <= *pfVar5 + 0.01) goto LAB_0019e82c;
          }
        }
      }
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool intersect(const Ray& r, float tmin,float tmax) {
		Vector3f o = r.o, d = r.d;
		const float eps = 1e-2;
		if (a[0] - eps <= o[0] && o[0] <= b[0] + eps && a[1] - eps <= o[1] && o[1] <= b[1] + eps && a[2] - eps <= o[2] && o[2] <= b[2] + eps)
			return 1;
		if (a[0] > b[0]) return 0; //empty box
		float t;
		tmin -= eps; tmax += eps;
		if (d[0] != 0.f)
		{
			if (d[0] > 0.f) t = (a[0] - o[0]) / d[0];
			else t = (b[0] - o[0]) / d[0];
			if (t >= tmin && t <= tmax)
			{
				Vector3f s = o + t * d;
				if (a[1] - eps <= s[1] && s[1] <= b[1] + eps && a[2] - eps <= s[2] && s[2] <= b[2] + eps)
					return 1;
			}
		}
		if (d[1] != 0.f)
		{
			if (d[1] > 0.f) t = (a[1] - o[1]) / d[1];
			else t = (b[1] - o[1]) / d[1];
			if (t >= tmin && t <= tmax)
			{
				Vector3f s = o + t * d;
				if (a[0] - eps <= s[0] && s[0] <= b[0] + eps && a[2] - eps <= s[2] && s[2] <= b[2] + eps)
					return 1;
			}
		}
		if (d[2] != 0.f)
		{
			if (d[2] > 0.f) t = (a[2] - o[2]) / d[2];
			else t = (b[2] - o[2]) / d[2];
			if (t >= tmin && t <= tmax)
			{
				Vector3f s = o + t * d;
				if (a[1] - eps <= s[1] && s[1] <= b[1] + eps && a[0] - eps <= s[0] && s[0] <= b[0] + eps)
					return 1;
			}
		}
		return 0;
	}